

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test::testBody
          (TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test *this)

{
  MemoryLeakDetector *this_00;
  bool bVar1;
  TestMemoryAllocator *allocator;
  char *pcVar2;
  char *otherBuffer;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString SStack_38;
  SimpleString output;
  
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  this_00 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  allocator = defaultNewAllocator();
  pcVar2 = MemoryLeakDetector::allocMemory(this_00,allocator,4,false);
  otherBuffer = MemoryLeakDetector::report
                          ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                           mem_leak_period_all);
  SimpleString::SimpleString(&output,otherBuffer);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"Memory leak(s) found");
  bVar1 = SimpleString::contains(&output,&SStack_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar1,"CHECK","output.contains(\"Memory leak(s) found\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xc9,pTVar4);
  SimpleString::~SimpleString(&SStack_38);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"size: 4");
  bVar1 = SimpleString::contains(&output,&SStack_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar1,"CHECK","output.contains(\"size: 4\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xca,pTVar4);
  SimpleString::~SimpleString(&SStack_38);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"new");
  bVar1 = SimpleString::contains(&output,&SStack_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar1,"CHECK","output.contains(\"new\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xcb,pTVar4);
  SimpleString::~SimpleString(&SStack_38);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"Total number of leaks");
  bVar1 = SimpleString::contains(&output,&SStack_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar1,"CHECK","output.contains(\"Total number of leaks\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0xcc,pTVar4);
  SimpleString::~SimpleString(&SStack_38);
  (*PlatformSpecificFree)(pcVar2);
  SimpleString::~SimpleString(&output);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeakOutsideCheckingPeriod)
{
    detector->stopChecking();
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    SimpleString output = detector->report(mem_leak_period_all);
    CHECK(output.contains("Memory leak(s) found"));
    CHECK(output.contains("size: 4"));
    CHECK(output.contains("new"));
    CHECK(output.contains("Total number of leaks"));
    PlatformSpecificFree(mem);
}